

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestThread.cpp
# Opt level: O0

uint testThread::ThreadData::proc(void *args)

{
  code *pcVar1;
  int iVar2;
  int local_1c;
  int i;
  ThreadData *threadData;
  void *args_local;
  
  if (*args != 0x7b) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestThread.cpp"
                          ,0x10,"threadData.intParam == 123");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  for (local_1c = 0; local_1c < 10000; local_1c = local_1c + 1) {
    Atomic::increment((uint32 *)((long)args + 4));
    Thread::yield();
  }
  return 0x2a;
}

Assistant:

static uint proc(void* args)
      {
        ThreadData& threadData = *(ThreadData*)args;

        ASSERT(threadData.intParam == 123);
        for (int i = 0; i < 10000; ++i)
        {
          Atomic::increment(threadData.counter);
          Thread::yield();
        }
        return 42;
      }